

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O1

void Omega_h::transfer_inherit_swap
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,Int prod_dim,LOs *keys2edges,
               LOs *keys2prods,LOs prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents)

{
  int *piVar1;
  Alloc *pAVar2;
  bool bVar3;
  Int IVar4;
  int iVar5;
  TagBase *tag;
  Tag<long> *this;
  Tag<signed_char> *this_00;
  Tag<int> *this_01;
  string *psVar6;
  Tag<double> *this_02;
  Int extraout_EDX;
  int i;
  Alloc *this_03;
  Read<signed_char> local_268;
  LOs local_258;
  LOs local_248;
  LOs local_238;
  LOs local_228;
  Read<signed_char> local_218;
  Read<signed_char> local_208;
  LOs local_1f8;
  Read<signed_char> prod_data;
  Read<signed_char> key_data;
  Read<signed_char> edge_data;
  Alloc *local_1b0 [2];
  LOs *local_1a0;
  Mesh *local_198;
  Alloc *local_190;
  pointer local_188;
  Alloc *local_180;
  void *local_178;
  Alloc *local_170;
  pointer local_168;
  Alloc *local_160;
  void *local_158;
  Alloc *local_150;
  void *local_148;
  Alloc *local_140;
  pointer local_138;
  Alloc *local_130;
  void *local_128;
  Alloc *local_120;
  pointer local_118;
  Alloc *local_110;
  void *local_108;
  Alloc *local_100;
  void *local_f8;
  Alloc *local_f0;
  pointer local_e8;
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  pointer local_c8;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  pointer local_98;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  pointer local_78;
  Alloc *local_70;
  void *local_68;
  Alloc *local_60;
  void *local_58;
  LOs *local_50;
  Read<signed_char> *local_48;
  LOs *local_40;
  TransferOpts *local_38;
  
  local_198 = new_mesh;
  local_38 = opts;
  IVar4 = Mesh::ntags(old_mesh,prod_dim);
  if (0 < IVar4) {
    i = 0;
    local_40 = &local_1f8;
    local_48 = &local_218;
    local_50 = &local_228;
    local_1a0 = keys2prods;
    do {
      tag = Mesh::get_tag(old_mesh,prod_dim,i);
      bVar3 = should_inherit(old_mesh,local_38,extraout_EDX,tag);
      if (bVar3) {
        iVar5 = (*tag->_vptr_TagBase[2])(tag);
        switch(iVar5) {
        case 0:
          local_60 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_60 = (Alloc *)(local_60->size * 8 + 1);
            }
            else {
              local_60->use_count = local_60->use_count + 1;
            }
          }
          local_58 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_70 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_70 = (Alloc *)(local_70->size * 8 + 1);
            }
            else {
              local_70->use_count = local_70->use_count + 1;
            }
          }
          local_68 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_80 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_80 = (Alloc *)(local_80->size * 8 + 1);
            }
            else {
              local_80->use_count = local_80->use_count + 1;
            }
          }
          local_78 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_90 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_90 = (Alloc *)(local_90->size * 8 + 1);
            }
            else {
              local_90->use_count = local_90->use_count + 1;
            }
          }
          local_88 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_a0 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_a0 = (Alloc *)(local_a0->size * 8 + 1);
            }
            else {
              local_a0->use_count = local_a0->use_count + 1;
            }
          }
          local_98 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          psVar6 = TagBase::name_abi_cxx11_(tag);
          this_00 = Mesh::get_tag<signed_char>(old_mesh,1,psVar6);
          IVar4 = TagBase::ncomps(&this_00->super_TagBase);
          Tag<signed_char>::array(this_00);
          local_1f8.write_.shared_alloc_.alloc = local_60;
          if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1f8.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
            }
            else {
              local_60->use_count = local_60->use_count + 1;
            }
          }
          local_1f8.write_.shared_alloc_.direct_ptr = local_58;
          local_208.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_208.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          unmap<signed_char>((Omega_h *)local_1b0,&local_1f8,&local_208,IVar4);
          read<signed_char>((Omega_h *)&key_data,(Write<signed_char> *)local_1b0);
          pAVar2 = local_1b0[0];
          if (((ulong)local_1b0[0] & 7) == 0 && local_1b0[0] != (Alloc *)0x0) {
            piVar1 = &local_1b0[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b0[0]);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_208.write_.shared_alloc_.alloc;
          if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
              local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_208.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_1f8.write_.shared_alloc_.alloc;
          if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_218.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_218.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_218.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_228.write_.shared_alloc_.alloc = local_70;
          if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_228.write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
            }
            else {
              local_70->use_count = local_70->use_count + 1;
            }
          }
          local_228.write_.shared_alloc_.direct_ptr = local_68;
          expand<signed_char>((Omega_h *)&prod_data,&local_218,&local_228,IVar4);
          pAVar2 = local_228.write_.shared_alloc_.alloc;
          if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
              local_228.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_228.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_218.write_.shared_alloc_.alloc;
          if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
              local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_218.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_218.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_238.write_.shared_alloc_.alloc = local_90;
          if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_238.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
            }
            else {
              local_90->use_count = local_90->use_count + 1;
            }
          }
          local_238.write_.shared_alloc_.direct_ptr = local_88;
          local_248.write_.shared_alloc_.alloc = local_a0;
          if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.write_.shared_alloc_.alloc = (Alloc *)(local_a0->size * 8 + 1);
            }
            else {
              local_a0->use_count = local_a0->use_count + 1;
            }
          }
          local_248.write_.shared_alloc_.direct_ptr = local_98;
          local_258.write_.shared_alloc_.alloc = local_80;
          if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_258.write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
            }
            else {
              local_80->use_count = local_80->use_count + 1;
            }
          }
          local_258.write_.shared_alloc_.direct_ptr = local_78;
          local_268.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_268.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_268.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          transfer_common<signed_char>
                    (old_mesh,local_198,prod_dim,&local_238,&local_248,&local_258,
                     &this_00->super_TagBase,&local_268);
          pAVar2 = local_268.write_.shared_alloc_.alloc;
          if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
              local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_258.write_.shared_alloc_.alloc;
          if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
              local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_258.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_258.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_248.write_.shared_alloc_.alloc;
          if (((ulong)local_248.write_.shared_alloc_.alloc & 7) == 0 &&
              local_248.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_248.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_248.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              local_238.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_238.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_238.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          pAVar2 = local_a0;
          if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
            piVar1 = &local_a0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_a0);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_90;
          if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
            piVar1 = &local_90->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_90);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_80;
          if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
            piVar1 = &local_80->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_80);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_70;
          this_03 = local_60;
          if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
            piVar1 = &local_70->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_70);
              operator_delete(pAVar2,0x48);
              this_03 = local_60;
            }
          }
          break;
        default:
          goto switchD_00408f94_caseD_1;
        case 2:
          local_b0 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_b0 = (Alloc *)(local_b0->size * 8 + 1);
            }
            else {
              local_b0->use_count = local_b0->use_count + 1;
            }
          }
          local_a8 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_c0 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_c0 = (Alloc *)(local_c0->size * 8 + 1);
            }
            else {
              local_c0->use_count = local_c0->use_count + 1;
            }
          }
          local_b8 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_d0 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_d0 = (Alloc *)(local_d0->size * 8 + 1);
            }
            else {
              local_d0->use_count = local_d0->use_count + 1;
            }
          }
          local_c8 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_e0 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_e0 = (Alloc *)(local_e0->size * 8 + 1);
            }
            else {
              local_e0->use_count = local_e0->use_count + 1;
            }
          }
          local_d8 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_f0 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_f0 = (Alloc *)(local_f0->size * 8 + 1);
            }
            else {
              local_f0->use_count = local_f0->use_count + 1;
            }
          }
          local_e8 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          psVar6 = TagBase::name_abi_cxx11_(tag);
          this_01 = Mesh::get_tag<int>(old_mesh,1,psVar6);
          IVar4 = TagBase::ncomps(&this_01->super_TagBase);
          Tag<int>::array(this_01);
          local_1f8.write_.shared_alloc_.alloc = local_b0;
          if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1f8.write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
            }
            else {
              local_b0->use_count = local_b0->use_count + 1;
            }
          }
          local_1f8.write_.shared_alloc_.direct_ptr = local_a8;
          local_208.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_208.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          unmap<int>((Omega_h *)local_1b0,&local_1f8,(Read<int> *)&local_208,IVar4);
          read<int>((Omega_h *)&key_data,(Write<int> *)local_1b0);
          pAVar2 = local_1b0[0];
          if (((ulong)local_1b0[0] & 7) == 0 && local_1b0[0] != (Alloc *)0x0) {
            piVar1 = &local_1b0[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b0[0]);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_208.write_.shared_alloc_.alloc;
          if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
              local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_208.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_1f8.write_.shared_alloc_.alloc;
          if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_218.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_218.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_218.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_228.write_.shared_alloc_.alloc = local_c0;
          if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_228.write_.shared_alloc_.alloc = (Alloc *)(local_c0->size * 8 + 1);
            }
            else {
              local_c0->use_count = local_c0->use_count + 1;
            }
          }
          local_228.write_.shared_alloc_.direct_ptr = local_b8;
          expand<int>((Omega_h *)&prod_data,(Read<int> *)&local_218,&local_228,IVar4);
          pAVar2 = local_228.write_.shared_alloc_.alloc;
          if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
              local_228.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_228.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_218.write_.shared_alloc_.alloc;
          if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
              local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_218.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_218.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_238.write_.shared_alloc_.alloc = local_e0;
          if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_238.write_.shared_alloc_.alloc = (Alloc *)(local_e0->size * 8 + 1);
            }
            else {
              local_e0->use_count = local_e0->use_count + 1;
            }
          }
          local_238.write_.shared_alloc_.direct_ptr = local_d8;
          local_248.write_.shared_alloc_.alloc = local_f0;
          if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.write_.shared_alloc_.alloc = (Alloc *)(local_f0->size * 8 + 1);
            }
            else {
              local_f0->use_count = local_f0->use_count + 1;
            }
          }
          local_248.write_.shared_alloc_.direct_ptr = local_e8;
          local_258.write_.shared_alloc_.alloc = local_d0;
          if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_258.write_.shared_alloc_.alloc = (Alloc *)(local_d0->size * 8 + 1);
            }
            else {
              local_d0->use_count = local_d0->use_count + 1;
            }
          }
          local_258.write_.shared_alloc_.direct_ptr = local_c8;
          local_268.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_268.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_268.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          transfer_common<int>
                    (old_mesh,local_198,prod_dim,&local_238,&local_248,&local_258,
                     &this_01->super_TagBase,(Read<int> *)&local_268);
          pAVar2 = local_268.write_.shared_alloc_.alloc;
          if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
              local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_258.write_.shared_alloc_.alloc;
          if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
              local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_258.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_258.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_248.write_.shared_alloc_.alloc;
          if (((ulong)local_248.write_.shared_alloc_.alloc & 7) == 0 &&
              local_248.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_248.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_248.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              local_238.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_238.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_238.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          pAVar2 = local_f0;
          if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
            piVar1 = &local_f0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_f0);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_e0;
          if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
            piVar1 = &local_e0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_e0);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_d0;
          if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
            piVar1 = &local_d0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_d0);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_c0;
          this_03 = local_b0;
          if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
            piVar1 = &local_c0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_c0);
              operator_delete(pAVar2,0x48);
              this_03 = local_b0;
            }
          }
          break;
        case 3:
          local_100 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_100 = (Alloc *)(local_100->size * 8 + 1);
            }
            else {
              local_100->use_count = local_100->use_count + 1;
            }
          }
          local_f8 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_110 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_110 = (Alloc *)(local_110->size * 8 + 1);
            }
            else {
              local_110->use_count = local_110->use_count + 1;
            }
          }
          local_108 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_120 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_120 = (Alloc *)(local_120->size * 8 + 1);
            }
            else {
              local_120->use_count = local_120->use_count + 1;
            }
          }
          local_118 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_130 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_130 = (Alloc *)(local_130->size * 8 + 1);
            }
            else {
              local_130->use_count = local_130->use_count + 1;
            }
          }
          local_128 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_140 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_140 = (Alloc *)(local_140->size * 8 + 1);
            }
            else {
              local_140->use_count = local_140->use_count + 1;
            }
          }
          local_138 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          psVar6 = TagBase::name_abi_cxx11_(tag);
          this = Mesh::get_tag<long>(old_mesh,1,psVar6);
          IVar4 = TagBase::ncomps(&this->super_TagBase);
          Tag<long>::array(this);
          local_1f8.write_.shared_alloc_.alloc = local_100;
          if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1f8.write_.shared_alloc_.alloc = (Alloc *)(local_100->size * 8 + 1);
            }
            else {
              local_100->use_count = local_100->use_count + 1;
            }
          }
          local_1f8.write_.shared_alloc_.direct_ptr = local_f8;
          local_208.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_208.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          unmap<long>((Omega_h *)local_1b0,&local_1f8,&local_208,IVar4);
          read<long>((Omega_h *)&key_data,(Write<signed_char> *)local_1b0);
          pAVar2 = local_1b0[0];
          if (((ulong)local_1b0[0] & 7) == 0 && local_1b0[0] != (Alloc *)0x0) {
            piVar1 = &local_1b0[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b0[0]);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_208.write_.shared_alloc_.alloc;
          if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
              local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_208.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_1f8.write_.shared_alloc_.alloc;
          if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_218.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_218.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_218.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_228.write_.shared_alloc_.alloc = local_110;
          if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_228.write_.shared_alloc_.alloc = (Alloc *)(local_110->size * 8 + 1);
            }
            else {
              local_110->use_count = local_110->use_count + 1;
            }
          }
          local_228.write_.shared_alloc_.direct_ptr = local_108;
          expand<long>((Omega_h *)&prod_data,&local_218,&local_228,IVar4);
          pAVar2 = local_228.write_.shared_alloc_.alloc;
          if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
              local_228.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_228.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_218.write_.shared_alloc_.alloc;
          if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
              local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_218.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_218.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_238.write_.shared_alloc_.alloc = local_130;
          if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_238.write_.shared_alloc_.alloc = (Alloc *)(local_130->size * 8 + 1);
            }
            else {
              local_130->use_count = local_130->use_count + 1;
            }
          }
          local_238.write_.shared_alloc_.direct_ptr = local_128;
          local_248.write_.shared_alloc_.alloc = local_140;
          if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.write_.shared_alloc_.alloc = (Alloc *)(local_140->size * 8 + 1);
            }
            else {
              local_140->use_count = local_140->use_count + 1;
            }
          }
          local_248.write_.shared_alloc_.direct_ptr = local_138;
          local_258.write_.shared_alloc_.alloc = local_120;
          if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_258.write_.shared_alloc_.alloc = (Alloc *)(local_120->size * 8 + 1);
            }
            else {
              local_120->use_count = local_120->use_count + 1;
            }
          }
          local_258.write_.shared_alloc_.direct_ptr = local_118;
          local_268.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_268.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_268.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          transfer_common<long>
                    (old_mesh,local_198,prod_dim,&local_238,&local_248,&local_258,
                     &this->super_TagBase,&local_268);
          pAVar2 = local_268.write_.shared_alloc_.alloc;
          if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
              local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_258.write_.shared_alloc_.alloc;
          if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
              local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_258.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_258.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_248.write_.shared_alloc_.alloc;
          if (((ulong)local_248.write_.shared_alloc_.alloc & 7) == 0 &&
              local_248.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_248.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_248.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              local_238.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_238.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_238.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          pAVar2 = local_140;
          if (((ulong)local_140 & 7) == 0 && local_140 != (Alloc *)0x0) {
            piVar1 = &local_140->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_140);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_130;
          if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
            piVar1 = &local_130->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_130);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_120;
          if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
            piVar1 = &local_120->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_120);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_110;
          this_03 = local_100;
          if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
            piVar1 = &local_110->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_110);
              operator_delete(pAVar2,0x48);
              this_03 = local_100;
            }
          }
          break;
        case 5:
          local_150 = (keys2edges->write_).shared_alloc_.alloc;
          if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_150 = (Alloc *)(local_150->size * 8 + 1);
            }
            else {
              local_150->use_count = local_150->use_count + 1;
            }
          }
          local_148 = (keys2edges->write_).shared_alloc_.direct_ptr;
          local_160 = (keys2prods->write_).shared_alloc_.alloc;
          if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_160 = (Alloc *)(local_160->size * 8 + 1);
            }
            else {
              local_160->use_count = local_160->use_count + 1;
            }
          }
          local_158 = (keys2prods->write_).shared_alloc_.direct_ptr;
          local_170 = (Alloc *)(prods2new_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_170 = (Alloc *)(local_170->size * 8 + 1);
            }
            else {
              local_170->use_count = local_170->use_count + 1;
            }
          }
          local_168 = ((prods2new_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          local_180 = *prods2new_ents.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_180 = (Alloc *)(local_180->size * 8 + 1);
            }
            else {
              local_180->use_count = local_180->use_count + 1;
            }
          }
          local_178 = *(void **)((long)prods2new_ents.write_.shared_alloc_.direct_ptr + 8);
          local_190 = (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
          if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_190 = (Alloc *)(local_190->size * 8 + 1);
            }
            else {
              local_190->use_count = local_190->use_count + 1;
            }
          }
          local_188 = ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
          psVar6 = TagBase::name_abi_cxx11_(tag);
          this_02 = Mesh::get_tag<double>(old_mesh,1,psVar6);
          IVar4 = TagBase::ncomps(&this_02->super_TagBase);
          Tag<double>::array(this_02);
          local_1f8.write_.shared_alloc_.alloc = local_150;
          if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1f8.write_.shared_alloc_.alloc = (Alloc *)(local_150->size * 8 + 1);
            }
            else {
              local_150->use_count = local_150->use_count + 1;
            }
          }
          local_1f8.write_.shared_alloc_.direct_ptr = local_148;
          local_208.write_.shared_alloc_.alloc = edge_data.write_.shared_alloc_.alloc;
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_208.write_.shared_alloc_.alloc =
                   (Alloc *)((edge_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (edge_data.write_.shared_alloc_.alloc)->use_count =
                   (edge_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          unmap<double>((Omega_h *)local_1b0,&local_1f8,&local_208,IVar4);
          read<double>((Omega_h *)&key_data,(Write<signed_char> *)local_1b0);
          pAVar2 = local_1b0[0];
          if (((ulong)local_1b0[0] & 7) == 0 && local_1b0[0] != (Alloc *)0x0) {
            piVar1 = &local_1b0[0]->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1b0[0]);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_208.write_.shared_alloc_.alloc;
          if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
              local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_208.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_1f8.write_.shared_alloc_.alloc;
          if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_218.write_.shared_alloc_.alloc = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_218.write_.shared_alloc_.alloc =
                   (Alloc *)((key_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (key_data.write_.shared_alloc_.alloc)->use_count =
                   (key_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_218.write_.shared_alloc_.direct_ptr = key_data.write_.shared_alloc_.direct_ptr;
          local_228.write_.shared_alloc_.alloc = local_160;
          if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_228.write_.shared_alloc_.alloc = (Alloc *)(local_160->size * 8 + 1);
            }
            else {
              local_160->use_count = local_160->use_count + 1;
            }
          }
          local_228.write_.shared_alloc_.direct_ptr = local_158;
          expand<double>((Omega_h *)&prod_data,&local_218,&local_228,IVar4);
          pAVar2 = local_228.write_.shared_alloc_.alloc;
          if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
              local_228.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_228.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_218.write_.shared_alloc_.alloc;
          if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
              local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_218.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_218.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_238.write_.shared_alloc_.alloc = local_180;
          if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_238.write_.shared_alloc_.alloc = (Alloc *)(local_180->size * 8 + 1);
            }
            else {
              local_180->use_count = local_180->use_count + 1;
            }
          }
          local_238.write_.shared_alloc_.direct_ptr = local_178;
          local_248.write_.shared_alloc_.alloc = local_190;
          if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.write_.shared_alloc_.alloc = (Alloc *)(local_190->size * 8 + 1);
            }
            else {
              local_190->use_count = local_190->use_count + 1;
            }
          }
          local_248.write_.shared_alloc_.direct_ptr = local_188;
          local_258.write_.shared_alloc_.alloc = local_170;
          if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_258.write_.shared_alloc_.alloc = (Alloc *)(local_170->size * 8 + 1);
            }
            else {
              local_170->use_count = local_170->use_count + 1;
            }
          }
          local_258.write_.shared_alloc_.direct_ptr = local_168;
          local_268.write_.shared_alloc_.alloc = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_268.write_.shared_alloc_.alloc =
                   (Alloc *)((prod_data.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (prod_data.write_.shared_alloc_.alloc)->use_count =
                   (prod_data.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_268.write_.shared_alloc_.direct_ptr = prod_data.write_.shared_alloc_.direct_ptr;
          transfer_common<double>
                    (old_mesh,local_198,prod_dim,&local_238,&local_248,&local_258,
                     &this_02->super_TagBase,(Read<double> *)&local_268);
          pAVar2 = local_268.write_.shared_alloc_.alloc;
          if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
              local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_258.write_.shared_alloc_.alloc;
          if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
              local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_258.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_258.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_248.write_.shared_alloc_.alloc;
          if (((ulong)local_248.write_.shared_alloc_.alloc & 7) == 0 &&
              local_248.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_248.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_248.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              local_238.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_238.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_238.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = prod_data.write_.shared_alloc_.alloc;
          if (((ulong)prod_data.write_.shared_alloc_.alloc & 7) == 0 &&
              prod_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(prod_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(prod_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = key_data.write_.shared_alloc_.alloc;
          if (((ulong)key_data.write_.shared_alloc_.alloc & 7) == 0 &&
              key_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(key_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(key_data.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          if (((ulong)edge_data.write_.shared_alloc_.alloc & 7) == 0 &&
              edge_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(edge_data.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(edge_data.write_.shared_alloc_.alloc);
              operator_delete(edge_data.write_.shared_alloc_.alloc,0x48);
            }
          }
          pAVar2 = local_190;
          if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
            piVar1 = &local_190->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_190);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_180;
          if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
            piVar1 = &local_180->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_180);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_170;
          if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
            piVar1 = &local_170->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_170);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_160;
          this_03 = local_150;
          if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
            piVar1 = &local_160->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_160);
              operator_delete(pAVar2,0x48);
              this_03 = local_150;
            }
          }
        }
        keys2prods = local_1a0;
        if (((ulong)this_03 & 7) == 0 && this_03 != (Alloc *)0x0) {
          piVar1 = &this_03->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(this_03);
            operator_delete(this_03,0x48);
          }
        }
      }
switchD_00408f94_caseD_1:
      i = i + 1;
      IVar4 = Mesh::ntags(old_mesh,prod_dim);
    } while (i < IVar4);
  }
  return;
}

Assistant:

static void transfer_inherit_swap(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, Int prod_dim, LOs keys2edges, LOs keys2prods,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(prod_dim); ++i) {
    auto tagbase = old_mesh->get_tag(prod_dim, i);
    if (should_inherit(old_mesh, opts, prod_dim, tagbase)) {
      switch (tagbase->type()) {
        case OMEGA_H_I8:
          transfer_inherit_swap_tmpl<I8>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_I32:
          transfer_inherit_swap_tmpl<I32>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_I64:
          transfer_inherit_swap_tmpl<I64>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
        case OMEGA_H_F64:
          transfer_inherit_swap_tmpl<Real>(old_mesh, new_mesh, prod_dim,
              keys2edges, keys2prods, prods2new_ents, same_ents2old_ents,
              same_ents2new_ents, tagbase);
          break;
      }
    }
  }
}